

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int FreeEXRImage(EXRImage *exrImage)

{
  char *pcVar1;
  uchar *puVar2;
  long lVar3;
  EXRImage *pEVar4;
  
  if (exrImage != (EXRImage *)0x0) {
    if (0 < exrImage->num_channels) {
      lVar3 = 0;
      do {
        if ((exrImage->channel_names != (char **)0x0) &&
           (pcVar1 = exrImage->channel_names[lVar3], pcVar1 != (char *)0x0)) {
          free(pcVar1);
        }
        if ((exrImage->images != (uchar **)0x0) &&
           (puVar2 = exrImage->images[lVar3], puVar2 != (uchar *)0x0)) {
          free(puVar2);
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < exrImage->num_channels);
    }
    if (exrImage->channel_names != (char **)0x0) {
      free(exrImage->channel_names);
    }
    if (exrImage->images != (uchar **)0x0) {
      free(exrImage->images);
    }
    if (exrImage->pixel_types != (int *)0x0) {
      free(exrImage->pixel_types);
    }
    if (exrImage->requested_pixel_types != (int *)0x0) {
      free(exrImage->requested_pixel_types);
    }
    if (0 < exrImage->num_custom_attributes) {
      lVar3 = 0;
      pEVar4 = exrImage;
      do {
        pcVar1 = pEVar4->custom_attributes[0].name;
        if (pcVar1 != (char *)0x0) {
          free(pcVar1);
        }
        pcVar1 = pEVar4->custom_attributes[0].type;
        if (pcVar1 != (char *)0x0) {
          free(pcVar1);
        }
        puVar2 = pEVar4->custom_attributes[0].value;
        if (puVar2 != (uchar *)0x0) {
          free(puVar2);
        }
        lVar3 = lVar3 + 1;
        pEVar4 = (EXRImage *)(pEVar4->custom_attributes + 1);
      } while (lVar3 < exrImage->num_custom_attributes);
    }
    return 0;
  }
  return -1;
}

Assistant:

int FreeEXRImage(EXRImage *exrImage) {

  if (exrImage == NULL) {
    return -1; // Err
  }

  for (int i = 0; i < exrImage->num_channels; i++) {

    if (exrImage->channel_names && exrImage->channel_names[i]) {
      free((char *)exrImage->channel_names[i]); // remove const
    }

    if (exrImage->images && exrImage->images[i]) {
      free(exrImage->images[i]);
    }
  }

  if (exrImage->channel_names) {
    free(exrImage->channel_names);
  }

  if (exrImage->images) {
    free(exrImage->images);
  }

  if (exrImage->pixel_types) {
    free(exrImage->pixel_types);
  }

  if (exrImage->requested_pixel_types) {
    free(exrImage->requested_pixel_types);
  }

  for (int i = 0; i < exrImage->num_custom_attributes; i++) {
    if (exrImage->custom_attributes[i].name) {
      free(exrImage->custom_attributes[i].name);
    }
    if (exrImage->custom_attributes[i].type) {
      free(exrImage->custom_attributes[i].type);
    }
    if (exrImage->custom_attributes[i].value) {
      free(exrImage->custom_attributes[i].value);
    }
  }

  return 0;
}